

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDirectDemo_ls.c
# Opt level: O2

int Jac2(sunrealtype tn,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,
        N_Vector tmp2,N_Vector tmp3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = *(long *)((long)J->content + 0x28);
  lVar3 = *(long *)((long)J->content + 0x40);
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
      lVar2 = *(long *)(lVar3 + lVar5 * 8);
      *(undefined8 *)(lVar2 + lVar1 * 8) = 0xc000000000000000;
      if (lVar5 != 4) {
        *(undefined8 *)(lVar2 + 8 + lVar1 * 8) = 0x3ff0000000000000;
      }
      if (lVar4 != 4) {
        *(undefined8 *)(lVar2 + 0x28 + lVar1 * 8) = 0x3ff0000000000000;
      }
    }
    lVar3 = lVar3 + 0x28;
  }
  return 0;
}

Assistant:

static int Jac2(sunrealtype tn, N_Vector y, N_Vector fy, SUNMatrix J,
                void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  int i, j, k;
  sunrealtype* kthCol;

  /*
     The components of f(t,y) which depend on y    are
                                               i,j
     f    , f      , and f      :
      i,j    i+1,j        i,j+1

     f    = -2 y    + alpha1 * y      + alpha2 * y
      i,j       i,j             i-1,j             i,j-1

     f      = -2 y      + alpha1 * y    + alpha2 * y
      i+1,j       i+1,j             i,j             i+1,j-1

     f      = -2 y      + alpha1 * y        + alpha2 * y
      i,j+1       i,j+1             i-1,j+1             i,j
  */

  for (j = 0; j < P2_MESHY; j++)
  {
    for (i = 0; i < P2_MESHX; i++)
    {
      k                                 = i + j * P2_MESHX;
      kthCol                            = SM_COLUMN_B(J, k);
      SM_COLUMN_ELEMENT_B(kthCol, k, k) = -TWO;
      if (i != P2_MESHX - 1)
      {
        SM_COLUMN_ELEMENT_B(kthCol, k + 1, k) = P2_ALPH1;
      }
      if (j != P2_MESHY - 1)
      {
        SM_COLUMN_ELEMENT_B(kthCol, k + P2_MESHX, k) = P2_ALPH2;
      }
    }
  }

  return (0);
}